

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O1

void __thiscall
TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_>::TPZDohrPrecond
          (TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *this,
          TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *cp)

{
  atomic_int *paVar1;
  TPZReference *pTVar2;
  int64_t iVar3;
  char cVar4;
  int iVar5;
  undefined4 extraout_var;
  
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZBaseMatrix_01a0bc00;
  iVar3 = (cp->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow =
       (cp->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = iVar3;
  cVar4 = (cp->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed =
       (cp->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = cVar4;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZDohrPrecond_01a09fb0;
  std::__cxx11::
  list<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
  ::list(&this->fGlobal,&cp->fGlobal);
  this->fCoarse = (TPZStepSolver<long_double> *)0x0;
  this->fNumCoarse = cp->fNumCoarse;
  this->fNumThreads = cp->fNumThreads;
  pTVar2 = (cp->fAssemble).fRef;
  (this->fAssemble).fRef = pTVar2;
  LOCK();
  paVar1 = &pTVar2->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  if (cp->fCoarse != (TPZStepSolver<long_double> *)0x0) {
    iVar5 = (*(cp->fCoarse->super_TPZMatrixSolver<long_double>).super_TPZSolver.super_TPZSavable.
              _vptr_TPZSavable[9])();
    this->fCoarse = (TPZStepSolver<long_double> *)CONCAT44(extraout_var,iVar5);
  }
  return;
}

Assistant:

TPZDohrPrecond<TVar, TSubStruct>::TPZDohrPrecond(const TPZDohrPrecond<TVar, TSubStruct> &cp) : TPZMatrix<TVar>(cp), fGlobal(cp.fGlobal), fCoarse(0),
fNumCoarse(cp.fNumCoarse), fNumThreads(cp.fNumThreads), fAssemble(cp.fAssemble)
{
	if (cp.fCoarse) {
		fCoarse = (TPZStepSolver<TVar> *) cp.fCoarse->Clone();
	}
}